

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClearWindowSettings(char *name)

{
  byte *pbVar1;
  ImVec2ih *pIVar2;
  int iVar3;
  ImGuiContext *pIVar4;
  ImGuiID IVar5;
  ImGuiWindow *window;
  ImGuiWindowSettings *pIVar6;
  ImGuiWindowSettings *pIVar7;
  ImGuiContext *g;
  
  IVar5 = ImHashStr(name,0,0);
  pIVar4 = GImGui;
  window = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,IVar5);
  if (window == (ImGuiWindow *)0x0) {
    IVar5 = ImHashStr(name,0,0);
    pIVar6 = (ImGuiWindowSettings *)(pIVar4->SettingsWindows).Buf.Data;
    pIVar2 = &pIVar6->Pos;
    if (pIVar6 != (ImGuiWindowSettings *)0x0) {
      pIVar7 = (ImGuiWindowSettings *)pIVar2;
      do {
        pIVar6 = pIVar7;
        if ((pIVar6->ID == IVar5) && (pIVar6->WantDelete != true)) break;
        iVar3._0_1_ = pIVar6[-1].Collapsed;
        iVar3._1_1_ = pIVar6[-1].IsChild;
        iVar3._2_1_ = pIVar6[-1].WantApply;
        iVar3._3_1_ = pIVar6[-1].WantDelete;
        pIVar7 = (ImGuiWindowSettings *)((long)&pIVar6->ID + (long)iVar3);
        pIVar6 = (ImGuiWindowSettings *)0x0;
      } while (pIVar7 != (ImGuiWindowSettings *)
                         ((long)&pIVar2->x + (long)(pIVar4->SettingsWindows).Buf.Size));
    }
  }
  else {
    pbVar1 = (byte *)((long)&window->Flags + 1);
    *pbVar1 = *pbVar1 | 1;
    InitOrLoadWindowSettings(window,(ImGuiWindowSettings *)0x0);
    pIVar6 = FindWindowSettingsByWindow(window);
  }
  if (pIVar6 != (ImGuiWindowSettings *)0x0) {
    pIVar6->WantDelete = true;
  }
  return;
}

Assistant:

void ImGui::ClearWindowSettings(const char* name)
{
    //IMGUI_DEBUG_LOG("ClearWindowSettings('%s')\n", name);
    ImGuiWindow* window = FindWindowByName(name);
    if (window != NULL)
    {
        window->Flags |= ImGuiWindowFlags_NoSavedSettings;
        InitOrLoadWindowSettings(window, NULL);
    }
    if (ImGuiWindowSettings* settings = window ? FindWindowSettingsByWindow(window) : FindWindowSettingsByID(ImHashStr(name)))
        settings->WantDelete = true;
}